

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::repaint<QRect>(QWidgetPrivate *this,QRect r)

{
  long lVar1;
  bool bVar2;
  QTLWExtra *pQVar3;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTLWExtra *tlwExtra;
  QWidget *q;
  QWidgetPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar2 = QWidget::isVisible((QWidget *)0x38bb1e);
  if (((bVar2) && (bVar2 = QWidget::updatesEnabled((QWidget *)0x38bb2e), bVar2)) &&
     (bVar2 = QRect::isEmpty((QRect *)in_stack_ffffffffffffffd0), !bVar2)) {
    QWidget::window((QWidget *)in_RDI);
    QWidget::d_func((QWidget *)0x38bb58);
    pQVar3 = maybeTopData(in_stack_ffffffffffffffd0);
    if (((pQVar3 != (QTLWExtra *)0x0) && (pQVar3->backingStore != (QBackingStore *)0x0)) &&
       (bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                            *)0x38bb87), bVar2)) {
      std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
      operator->((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_> *)
                 0x38bb9b);
      QWidgetRepaintManager::markDirty<QRect>
                ((QWidgetRepaintManager *)r._8_8_,(QRect *)r._0_8_,(QWidget *)this,q._4_4_,
                 (BufferState)q);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::repaint(T r)
{
    Q_Q(QWidget);

    if (!q->isVisible() || !q->updatesEnabled() || r.isEmpty())
        return;

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(r, q, QWidgetRepaintManager::UpdateNow);
}